

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_sse2.c
# Opt level: O1

void av1_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  byte *pbVar1;
  uint16_t *puVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [14];
  undefined1 auVar28 [15];
  undefined1 auVar29 [14];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  ushort uVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined1 auVar52 [15];
  unkuint9 Var53;
  undefined1 auVar54 [11];
  undefined1 auVar55 [13];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  byte bVar58;
  byte bVar59;
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar68;
  int iVar69;
  uint uVar70;
  undefined7 in_register_00000011;
  uint8_t *puVar71;
  uint8_t *puVar72;
  int iVar73;
  ushort *puVar74;
  undefined1 *puVar75;
  int *piVar76;
  undefined1 (*pauVar77) [16];
  ulong uVar78;
  long lVar79;
  undefined1 *puVar80;
  int iVar81;
  uint uVar82;
  int iVar83;
  uint8_t *puVar84;
  int iVar85;
  int subblock_idx;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  double dVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [14];
  uint uVar92;
  double dVar93;
  double dVar94;
  double dVar100;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar102;
  double dVar103;
  uint uVar106;
  uint uVar107;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar108;
  undefined1 auVar109 [14];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  double dVar113;
  double d_factor [4];
  __m128i vsrc [5] [2];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  uint16_t frame_sse [1152];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  int local_2afc;
  undefined1 local_2ae8 [16];
  double local_2aa8;
  double local_2a38 [2];
  int local_2a28 [4];
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 local_29f8 [12];
  undefined1 local_2998 [16];
  undefined1 local_2988 [16];
  double adStack_2978 [4];
  double adStack_2958 [4];
  ushort local_2938 [1152];
  int local_2038 [1024];
  undefined1 local_1038 [4104];
  ulong uVar66;
  ulong uVar67;
  undefined1 auVar98 [16];
  short sVar99;
  undefined2 uVar101;
  
  uVar68 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar4 = block_size_high[uVar68];
  bVar5 = block_size_wide[uVar68];
  iVar83 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar69 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar69 < iVar83) {
    iVar83 = iVar69;
  }
  dVar113 = (double)q_factor / 20.0;
  dVar113 = dVar113 * dVar113;
  dVar94 = 1.0;
  if (dVar113 <= 1.0) {
    dVar94 = dVar113;
  }
  dVar103 = (double)q_factor * 0.015625;
  dVar94 = (double)(-(ulong)(dVar113 < 1e-05) & 0x3ee4f8b588e368f1 |
                   ~-(ulong)(dVar113 < 1e-05) & (ulong)dVar94);
  local_2ae8._8_8_ = 0;
  local_2ae8._0_8_ = dVar94;
  dVar89 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  dVar113 = 1.0;
  if (dVar89 <= 1.0) {
    dVar113 = dVar89;
  }
  local_2a28[0] = 0;
  local_2a28[1] = 0;
  local_2a28[2] = 0;
  local_2a28[3] = 0;
  local_2a38[0] = 0.0;
  local_2a38[1] = 0.0;
  lVar86 = 0;
  memset(local_2938,0,0x900);
  memset(local_2038,0,0x1000);
  auVar111._0_8_ = (double)iVar83 * 0.1;
  auVar111._8_8_ = 0;
  if (auVar111._0_8_ <= 1.0) {
    auVar111 = ZEXT816(0x3ff0000000000000);
  }
  auVar104._0_8_ = auVar111._0_8_;
  do {
    auVar90 = pshuflw(ZEXT416((uint)subblock_mvs[lVar86]),ZEXT416((uint)subblock_mvs[lVar86]),0x60);
    dVar93 = (double)(auVar90._0_4_ >> 0x10);
    dVar100 = (double)(auVar90._4_4_ >> 0x10);
    dVar93 = dVar100 * dVar100 + dVar93 * dVar93;
    if (dVar93 < 0.0) {
      dVar93 = sqrt(dVar93);
      auVar104._8_8_ = 0;
      auVar111 = auVar104;
    }
    else {
      dVar93 = SQRT(dVar93);
    }
    dVar93 = dVar93 / auVar111._0_8_;
    if (dVar93 <= 1.0) {
      dVar93 = 1.0;
    }
    local_2a38[lVar86] = dVar93;
    lVar86 = lVar86 + 1;
  } while (lVar86 != 4);
  local_2aa8 = dVar103 * dVar103 * 0.5;
  if (q_factor < 0x80) {
    local_2aa8 = dVar94;
  }
  if (0 < num_planes) {
    uVar68 = 0;
    local_2afc = 0;
    do {
      iVar83 = mbd->plane[uVar68].subsampling_x;
      iVar69 = mbd->plane[uVar68].subsampling_y;
      bVar58 = bVar4 >> ((byte)iVar69 & 0x1f);
      uVar63 = (uint)bVar58;
      uVar66 = (ulong)uVar63;
      bVar59 = bVar5 >> ((byte)iVar83 & 0x1f);
      uVar64 = (uint)bVar59;
      uVar67 = (ulong)uVar64;
      iVar83 = iVar83 - mbd->plane[0].subsampling_x;
      iVar69 = iVar69 - mbd->plane[0].subsampling_y;
      bVar6 = (byte)iVar69;
      bVar7 = (byte)iVar83;
      dVar94 = 0.04;
      if (uVar68 != 0) {
        dVar94 = 1.0 / (double)((1 << (bVar6 + bVar7 & 0x1f)) + 0x19);
      }
      uVar92 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar68 != 0) * 4 + -0x28);
      puVar72 = frame_to_filter->store_buf_adr[uVar68 - 4] +
                (int)(uVar64 * mb_col + uVar92 * uVar63 * mb_row);
      dVar103 = log(noise_levels[uVar68] + noise_levels[uVar68] + 5.0);
      if ((uVar68 == 1) && (uVar63 != 0)) {
        uVar65 = 1 << (bVar6 & 0x1f);
        uVar70 = 1 << (bVar7 & 0x1f);
        if ((int)uVar70 < 2) {
          uVar70 = 1;
        }
        if ((int)uVar65 < 2) {
          uVar65 = 1;
        }
        auVar90._8_8_ = 0;
        auVar90._0_8_ = local_2ae8._8_8_;
        local_2ae8 = auVar90 << 0x40;
        do {
          if (uVar64 != 0) {
            uVar78 = 0;
            do {
              if (iVar69 != 0x1f) {
                iVar81 = ((int)uVar78 << (bVar7 & 0x1f)) +
                         (local_2ae8._0_4_ << (bVar6 & 0x1f)) * 0x24 + 2;
                lVar86 = uVar78 + local_2ae8._0_8_ * 0x20;
                uVar82 = 0;
                do {
                  if (iVar83 != 0x1f) {
                    iVar85 = local_2038[lVar86];
                    uVar87 = (ulong)uVar70;
                    iVar73 = iVar81;
                    do {
                      iVar85 = iVar85 + (uint)local_2938[iVar73];
                      iVar73 = iVar73 + 1;
                      uVar87 = uVar87 - 1;
                    } while (uVar87 != 0);
                    local_2038[lVar86] = iVar85;
                  }
                  uVar82 = uVar82 + 1;
                  iVar81 = iVar81 + 0x24;
                } while (uVar82 != uVar65);
              }
              uVar78 = uVar78 + 1;
            } while (uVar78 != uVar67);
          }
          uVar78 = local_2ae8._0_8_ + 1;
          local_2ae8._0_8_ = uVar78;
        } while (uVar78 != uVar66);
      }
      lVar86 = (long)local_2afc;
      puVar84 = pred + lVar86;
      if (uVar63 != 0) {
        uVar70 = 0;
        puVar74 = local_2938;
        puVar71 = puVar84;
        do {
          if (uVar64 != 0) {
            uVar78 = 0;
            do {
              pbVar1 = puVar72 + uVar78;
              bVar34 = *pbVar1;
              bVar35 = pbVar1[1];
              bVar36 = pbVar1[2];
              bVar37 = pbVar1[3];
              bVar38 = pbVar1[4];
              bVar39 = pbVar1[5];
              bVar40 = pbVar1[6];
              bVar41 = pbVar1[7];
              bVar42 = pbVar1[8];
              bVar43 = pbVar1[9];
              bVar44 = pbVar1[10];
              bVar45 = pbVar1[0xb];
              bVar46 = pbVar1[0xc];
              bVar47 = pbVar1[0xd];
              bVar48 = pbVar1[0xe];
              bVar49 = pbVar1[0xf];
              auVar111 = *(undefined1 (*) [16])(puVar71 + uVar78);
              bVar6 = auVar111[0];
              auVar110[0] = (bVar34 < bVar6) * bVar6 | (bVar34 >= bVar6) * bVar34;
              bVar7 = auVar111[1];
              auVar110[1] = (bVar35 < bVar7) * bVar7 | (bVar35 >= bVar7) * bVar35;
              bVar8 = auVar111[2];
              auVar110[2] = (bVar36 < bVar8) * bVar8 | (bVar36 >= bVar8) * bVar36;
              bVar9 = auVar111[3];
              auVar110[3] = (bVar37 < bVar9) * bVar9 | (bVar37 >= bVar9) * bVar37;
              bVar10 = auVar111[4];
              auVar110[4] = (bVar38 < bVar10) * bVar10 | (bVar38 >= bVar10) * bVar38;
              bVar11 = auVar111[5];
              auVar110[5] = (bVar39 < bVar11) * bVar11 | (bVar39 >= bVar11) * bVar39;
              bVar12 = auVar111[6];
              auVar110[6] = (bVar40 < bVar12) * bVar12 | (bVar40 >= bVar12) * bVar40;
              bVar13 = auVar111[7];
              auVar110[7] = (bVar41 < bVar13) * bVar13 | (bVar41 >= bVar13) * bVar41;
              bVar14 = auVar111[8];
              auVar110[8] = (bVar42 < bVar14) * bVar14 | (bVar42 >= bVar14) * bVar42;
              bVar15 = auVar111[9];
              auVar110[9] = (bVar43 < bVar15) * bVar15 | (bVar43 >= bVar15) * bVar43;
              bVar16 = auVar111[10];
              auVar110[10] = (bVar44 < bVar16) * bVar16 | (bVar44 >= bVar16) * bVar44;
              bVar17 = auVar111[0xb];
              auVar110[0xb] = (bVar45 < bVar17) * bVar17 | (bVar45 >= bVar17) * bVar45;
              bVar18 = auVar111[0xc];
              auVar110[0xc] = (bVar46 < bVar18) * bVar18 | (bVar46 >= bVar18) * bVar46;
              bVar19 = auVar111[0xd];
              auVar110[0xd] = (bVar47 < bVar19) * bVar19 | (bVar47 >= bVar19) * bVar47;
              bVar20 = auVar111[0xe];
              auVar110[0xe] = (bVar48 < bVar20) * bVar20 | (bVar48 >= bVar20) * bVar48;
              bVar21 = auVar111[0xf];
              auVar110[0xf] = (bVar49 < bVar21) * bVar21 | (bVar49 >= bVar21) * bVar49;
              auVar96[0] = (bVar6 < bVar34) * bVar6 | (bVar6 >= bVar34) * bVar34;
              auVar96[1] = (bVar7 < bVar35) * bVar7 | (bVar7 >= bVar35) * bVar35;
              auVar96[2] = (bVar8 < bVar36) * bVar8 | (bVar8 >= bVar36) * bVar36;
              auVar96[3] = (bVar9 < bVar37) * bVar9 | (bVar9 >= bVar37) * bVar37;
              auVar96[4] = (bVar10 < bVar38) * bVar10 | (bVar10 >= bVar38) * bVar38;
              auVar96[5] = (bVar11 < bVar39) * bVar11 | (bVar11 >= bVar39) * bVar39;
              auVar96[6] = (bVar12 < bVar40) * bVar12 | (bVar12 >= bVar40) * bVar40;
              auVar96[7] = (bVar13 < bVar41) * bVar13 | (bVar13 >= bVar41) * bVar41;
              auVar96[8] = (bVar14 < bVar42) * bVar14 | (bVar14 >= bVar42) * bVar42;
              auVar96[9] = (bVar15 < bVar43) * bVar15 | (bVar15 >= bVar43) * bVar43;
              auVar96[10] = (bVar16 < bVar44) * bVar16 | (bVar16 >= bVar44) * bVar44;
              auVar96[0xb] = (bVar17 < bVar45) * bVar17 | (bVar17 >= bVar45) * bVar45;
              auVar96[0xc] = (bVar18 < bVar46) * bVar18 | (bVar18 >= bVar46) * bVar46;
              auVar96[0xd] = (bVar19 < bVar47) * bVar19 | (bVar19 >= bVar47) * bVar47;
              auVar96[0xe] = (bVar20 < bVar48) * bVar20 | (bVar20 >= bVar48) * bVar48;
              auVar96[0xf] = (bVar21 < bVar49) * bVar21 | (bVar21 >= bVar49) * bVar49;
              auVar111 = psubusb(auVar110,auVar96);
              auVar23[0xd] = 0;
              auVar23._0_13_ = auVar111._0_13_;
              auVar23[0xe] = auVar111[7];
              auVar26[0xc] = auVar111[6];
              auVar26._0_12_ = auVar111._0_12_;
              auVar26._13_2_ = auVar23._13_2_;
              auVar28[0xb] = 0;
              auVar28._0_11_ = auVar111._0_11_;
              auVar28._12_3_ = auVar26._12_3_;
              auVar30[10] = auVar111[5];
              auVar30._0_10_ = auVar111._0_10_;
              auVar30._11_4_ = auVar28._11_4_;
              auVar31[9] = 0;
              auVar31._0_9_ = auVar111._0_9_;
              auVar31._10_5_ = auVar30._10_5_;
              auVar32[8] = auVar111[4];
              auVar32._0_8_ = auVar111._0_8_;
              auVar32._9_6_ = auVar31._9_6_;
              auVar52._7_8_ = 0;
              auVar52._0_7_ = auVar32._8_7_;
              Var53 = CONCAT81(SUB158(auVar52 << 0x40,7),auVar111[3]);
              auVar60._9_6_ = 0;
              auVar60._0_9_ = Var53;
              auVar54._1_10_ = SUB1510(auVar60 << 0x30,5);
              auVar54[0] = auVar111[2];
              auVar61._11_4_ = 0;
              auVar61._0_11_ = auVar54;
              auVar55._1_12_ = SUB1512(auVar61 << 0x20,3);
              auVar55[0] = auVar111[1];
              auVar97._0_2_ = (ushort)auVar111[0] * (ushort)auVar111[0];
              auVar97._2_2_ = auVar55._0_2_ * auVar55._0_2_;
              auVar97._4_2_ = auVar54._0_2_ * auVar54._0_2_;
              sVar99 = (short)Var53;
              auVar97._6_2_ = sVar99 * sVar99;
              auVar97._8_2_ = auVar32._8_2_ * auVar32._8_2_;
              auVar97._10_2_ = auVar30._10_2_ * auVar30._10_2_;
              uVar33 = auVar23._13_2_ >> 8;
              auVar97._12_2_ = auVar26._12_2_ * auVar26._12_2_;
              auVar97._14_2_ = uVar33 * uVar33;
              auVar112._0_2_ = (ushort)auVar111[8] * (ushort)auVar111[8];
              auVar112._2_2_ = (ushort)auVar111[9] * (ushort)auVar111[9];
              auVar112._4_2_ = (ushort)auVar111[10] * (ushort)auVar111[10];
              auVar112._6_2_ = (ushort)auVar111[0xb] * (ushort)auVar111[0xb];
              auVar112._8_2_ = (ushort)auVar111[0xc] * (ushort)auVar111[0xc];
              auVar112._10_2_ = (ushort)auVar111[0xd] * (ushort)auVar111[0xd];
              auVar112._12_2_ = (ushort)auVar111[0xe] * (ushort)auVar111[0xe];
              auVar112._14_2_ = (ushort)auVar111[0xf] * (ushort)auVar111[0xf];
              *(undefined1 (*) [16])(puVar74 + uVar78 + 2) = auVar97;
              *(undefined1 (*) [16])(puVar74 + uVar78 + 10) = auVar112;
              uVar78 = uVar78 + 0x10;
            } while (uVar78 < uVar67);
            puVar74[0] = 0;
            puVar74[1] = 0;
          }
          (puVar74 + uVar67 + 2)[0] = 0;
          (puVar74 + uVar67 + 2)[1] = 0;
          puVar72 = puVar72 + uVar92;
          puVar71 = puVar71 + uVar67;
          puVar74 = puVar74 + 0x24;
          uVar70 = uVar70 + 1;
        } while (uVar70 != uVar63);
      }
      if (uVar64 != 0) {
        puVar75 = local_1038;
        uVar78 = 0;
        do {
          pauVar77 = (undefined1 (*) [16])(local_2938 + uVar78);
          lVar79 = 0x50;
          do {
            auVar111 = *pauVar77;
            auVar24._10_2_ = 0;
            auVar24._0_10_ = auVar111._0_10_;
            auVar24._12_2_ = auVar111._6_2_;
            auVar27._8_2_ = auVar111._4_2_;
            auVar27._0_8_ = auVar111._0_8_;
            auVar27._10_4_ = auVar24._10_4_;
            auVar56._6_8_ = 0;
            auVar56._0_6_ = auVar27._8_6_;
            auVar105._6_8_ = SUB148(auVar56 << 0x40,6);
            auVar105._4_2_ = auVar111._2_2_;
            auVar105._0_2_ = auVar111._0_2_;
            auVar105._2_2_ = 0;
            auVar105._14_2_ = 0;
            if (uVar78 == 0) {
              auVar105._8_4_ = auVar27._8_4_;
              auVar105._4_4_ = auVar105._8_4_;
              auVar105._0_4_ = auVar105._8_4_;
              auVar105._12_4_ = auVar24._10_4_ >> 0x10;
            }
            auVar95._0_4_ = CONCAT22(0,auVar111._8_2_);
            uVar101 = auVar111._10_2_;
            auVar95._4_2_ = uVar101;
            auVar95._6_2_ = 0;
            auVar95._8_2_ = auVar111._12_2_;
            auVar95._10_2_ = 0;
            auVar95._12_2_ = auVar111._14_2_;
            *(undefined1 (*) [16])((long)local_2a28 + lVar79) = auVar105;
            if ((long)(int)(uVar64 - 4) <= (long)uVar78) {
              auVar95._6_2_ = 0;
              auVar95._8_2_ = uVar101;
              auVar95._10_2_ = 0;
              auVar95._12_2_ = uVar101;
            }
            auVar98._14_2_ = 0;
            auVar98._0_14_ = auVar95;
            *(undefined1 (*) [16])((long)&local_2a18 + lVar79) = auVar98;
            pauVar77 = (undefined1 (*) [16])(pauVar77[4] + 8);
            lVar79 = lVar79 + 0x20;
          } while (lVar79 != 0xb0);
          local_2a18 = local_29f8[4];
          uStack_2a10 = local_29f8[5];
          local_2a08 = local_29f8[6];
          uStack_2a00 = local_29f8[7];
          local_29f8[0] = local_29f8[4];
          local_29f8[1] = local_29f8[5];
          local_29f8[2] = local_29f8[6];
          local_29f8[3] = local_29f8[7];
          if (uVar63 != 0) {
            uVar87 = 0;
            puVar80 = puVar75;
            do {
              uVar92 = 0;
              uVar70 = 0;
              uVar65 = 0;
              uVar82 = 0;
              lVar79 = 0x10;
              uVar102 = 0;
              uVar106 = 0;
              uVar107 = 0;
              uVar108 = 0;
              do {
                uVar92 = uVar92 + *(int *)((long)local_2a28 + lVar79);
                uVar70 = uVar70 + *(int *)((long)local_2a28 + lVar79 + 4);
                uVar65 = uVar65 + *(int *)((long)local_2a28 + lVar79 + 8);
                uVar82 = uVar82 + *(int *)((long)local_2a28 + lVar79 + 0xc);
                uVar102 = uVar102 + *(int *)((long)&local_2a18 + lVar79);
                uVar106 = uVar106 + *(int *)((long)&local_2a18 + lVar79 + 4);
                uVar107 = uVar107 + *(int *)((long)&uStack_2a10 + lVar79);
                uVar108 = uVar108 + *(int *)((long)&uStack_2a10 + lVar79 + 4);
                lVar79 = lVar79 + 0x20;
              } while (lVar79 != 0xb0);
              lVar79 = 0;
              do {
                uVar3 = *(undefined8 *)((long)local_29f8 + lVar79 + 8);
                uVar50 = *(undefined8 *)((long)local_29f8 + lVar79 + 0x10);
                uVar51 = *(undefined8 *)((long)local_29f8 + lVar79 + 0x18);
                *(undefined8 *)((long)&local_2a18 + lVar79) =
                     *(undefined8 *)((long)local_29f8 + lVar79);
                *(undefined8 *)((long)&uStack_2a10 + lVar79) = uVar3;
                *(undefined8 *)((long)&local_2a08 + lVar79) = uVar50;
                *(undefined8 *)((long)&uStack_2a00 + lVar79) = uVar51;
                lVar79 = lVar79 + 0x20;
              } while (lVar79 != 0x80);
              if ((long)(int)(uVar63 - 4) < (long)uVar87) {
                local_2998._8_8_ = local_29f8[9];
                local_2998._0_8_ = local_29f8[8];
                local_2988._8_8_ = local_29f8[0xb];
                local_2988._0_8_ = local_29f8[10];
              }
              else {
                auVar111 = *pauVar77;
                auVar22._10_2_ = 0;
                auVar22._0_10_ = auVar111._0_10_;
                auVar22._12_2_ = auVar111._6_2_;
                auVar25._8_2_ = auVar111._4_2_;
                auVar25._0_8_ = auVar111._0_8_;
                auVar25._10_4_ = auVar22._10_4_;
                auVar57._6_8_ = 0;
                auVar57._0_6_ = auVar25._8_6_;
                auVar29._4_2_ = auVar111._2_2_;
                auVar29._0_4_ = auVar111._0_4_;
                auVar29._6_8_ = SUB148(auVar57 << 0x40,6);
                local_2998._0_4_ = auVar111._0_4_ & 0xffff;
                local_2998._4_10_ = auVar29._4_10_;
                local_2998._14_2_ = 0;
                if (uVar78 == 0) {
                  local_2998._8_4_ = auVar25._8_4_;
                  local_2998._4_4_ = local_2998._8_4_;
                  local_2998._0_4_ = local_2998._8_4_;
                  local_2998._12_4_ = auVar22._10_4_ >> 0x10;
                }
                auVar109._0_4_ = CONCAT22(0,auVar111._8_2_);
                uVar101 = auVar111._10_2_;
                auVar109._4_2_ = uVar101;
                auVar109._6_2_ = 0;
                auVar109._8_2_ = auVar111._12_2_;
                auVar109._10_2_ = 0;
                auVar109._12_2_ = auVar111._14_2_;
                if ((long)(int)(uVar64 - 4) <= (long)uVar78) {
                  auVar109._6_2_ = 0;
                  auVar109._8_2_ = uVar101;
                  auVar109._10_2_ = 0;
                  auVar109._12_2_ = uVar101;
                }
                local_2988._14_2_ = 0;
                local_2988._0_14_ = auVar109;
                pauVar77 = (undefined1 (*) [16])(pauVar77[4] + 8);
              }
              lVar79 = 0;
              do {
                *(uint32_t *)(puVar80 + lVar79) =
                     (sse_bytemask_2x4[0][1][lVar79 * 2 + 3] & uVar108) +
                     (sse_bytemask_2x4[0][0][lVar79 * 2 + 3] & uVar82) +
                     (sse_bytemask_2x4[0][1][lVar79 * 2 + 1] & uVar106) +
                     (sse_bytemask_2x4[0][0][lVar79 * 2 + 1] & uVar70) +
                     (sse_bytemask_2x4[0][1][lVar79 * 2 + 2] & uVar107) +
                     (sse_bytemask_2x4[0][0][lVar79 * 2 + 2] & uVar65) +
                     (sse_bytemask_2x4[0][1][lVar79 * 2] & uVar102) +
                     (sse_bytemask_2x4[0][0][lVar79 * 2] & uVar92);
                lVar79 = lVar79 + 4;
              } while (lVar79 != 0x10);
              uVar87 = uVar87 + 1;
              puVar80 = puVar80 + 0x80;
            } while (uVar87 != uVar66);
          }
          uVar78 = uVar78 + 4;
          puVar75 = puVar75 + 0x10;
        } while (uVar78 < uVar67);
      }
      dVar103 = 1.0 / ((dVar103 + 0.5) * local_2aa8 *
                      (double)(~-(ulong)(dVar89 < 1e-05) & (ulong)dVar113 |
                              -(ulong)(dVar89 < 1e-05) & 0x3ee4f8b588e368f1));
      lVar79 = 0;
      do {
        uVar3 = *(undefined8 *)(subblock_mses + lVar79);
        adStack_2958[lVar79] = (double)(int)uVar3 * 0.008333333333333333;
        adStack_2958[lVar79 + 1] = (double)(int)((ulong)uVar3 >> 0x20) * 0.008333333333333333;
        auVar91._0_8_ = local_2a38[lVar79] * dVar103;
        auVar91._8_8_ = local_2a38[lVar79 + 1] * dVar103;
        *(undefined1 (*) [16])(adStack_2978 + lVar79) = auVar91;
        lVar79 = lVar79 + 2;
      } while (lVar79 != 4);
      if (tf_wgt_calc_lvl == 0) {
        if (uVar63 != 0) {
          uVar78 = 0;
          puVar75 = local_1038;
          piVar76 = local_2038;
          iVar83 = 0;
          auVar111 = _DAT_004cf240;
          do {
            if (uVar64 != 0) {
              auVar62._8_8_ = 0;
              auVar62._0_8_ = local_2ae8._8_8_;
              local_2ae8 = auVar62 << 0x40;
              uVar87 = 0;
              do {
                bVar6 = puVar84[uVar87];
                uVar88 = (ulong)(((uint)(bVar59 >> 1 <= uVar87) | (uint)(bVar58 >> 1 <= uVar78) * 2)
                                << 3);
                dVar103 = ((double)(uint)(piVar76[uVar87] + *(int *)(puVar75 + uVar87 * 4)) * dVar94
                           * 0.041666666666666664 + *(double *)((long)adStack_2958 + uVar88)) *
                          *(double *)((long)adStack_2978 + uVar88);
                uVar88 = -(ulong)(dVar103 < 7.0);
                dVar103 = exp((double)(~uVar88 & 0xc01c000000000000 |
                                      ((ulong)dVar103 ^ auVar111._0_8_) & uVar88));
                auVar111 = _DAT_004cf240;
                count[lVar86 + (long)iVar83 + uVar87] =
                     count[lVar86 + (long)iVar83 + uVar87] + (short)(int)(dVar103 * 1000.0);
                accum[lVar86 + (long)iVar83 + uVar87] =
                     accum[lVar86 + (long)iVar83 + uVar87] + (uint)bVar6 * (int)(dVar103 * 1000.0);
                uVar87 = uVar87 + 1;
              } while (uVar67 != uVar87);
              iVar83 = iVar83 + (int)uVar87;
            }
            uVar78 = uVar78 + 1;
            piVar76 = piVar76 + 0x20;
            puVar75 = puVar75 + 0x80;
            puVar84 = puVar84 + uVar67;
          } while (uVar78 != uVar66);
        }
      }
      else if (uVar63 != 0) {
        puVar2 = count + lVar86;
        local_2ae8._0_8_ = puVar2;
        uVar78 = 0;
        puVar75 = local_1038;
        piVar76 = local_2038;
        iVar83 = 0;
        do {
          if (uVar64 != 0) {
            uVar87 = 0;
            do {
              uVar88 = (ulong)(((uint)(bVar59 >> 1 <= uVar87) | (uint)(bVar58 >> 1 <= uVar78) * 2)
                              << 3);
              dVar103 = ((double)(uint)(piVar76[uVar87] + *(int *)(puVar75 + uVar87 * 4)) * dVar94 *
                         0.041666666666666664 + *(double *)((long)adStack_2958 + uVar88)) *
                        *(double *)((long)adStack_2978 + uVar88);
              if (7.0 <= dVar103) {
                dVar103 = 7.0;
              }
              iVar69 = (int)((float)((int)((float)dVar103 * -12102203.0) + 0x3f7f127f) * 1000.0 +
                            0.5);
              bVar6 = puVar84[uVar87];
              puVar2[(long)iVar83 + uVar87] = puVar2[(long)iVar83 + uVar87] + (short)iVar69;
              accum[lVar86 + (long)iVar83 + uVar87] =
                   accum[lVar86 + (long)iVar83 + uVar87] + (uint)bVar6 * iVar69;
              uVar87 = uVar87 + 1;
            } while (uVar67 != uVar87);
            iVar83 = iVar83 + (int)uVar87;
          }
          uVar78 = uVar78 + 1;
          piVar76 = piVar76 + 0x20;
          puVar75 = puVar75 + 0x80;
          puVar84 = puVar84 + uVar67;
        } while (uVar78 != uVar66);
      }
      local_2afc = local_2afc + uVar64 * uVar63;
      uVar68 = uVar68 + 1;
    } while (uVar68 != (uint)num_planes);
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}